

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,VariableDeclaration *v)

{
  if ((v->declaredType).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
  }
  if ((v->initialValue).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
  }
  (*this->_vptr_ASTVisitor[0xb])(this,&v->annotation);
  return;
}

Assistant:

virtual void visit (AST::VariableDeclaration& v)
    {
        visitObjectIfNotNull (v.declaredType);
        visitObjectIfNotNull (v.initialValue);
        visit (v.annotation);
    }